

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O3

PixelBufferAccess *
deqp::gls::FragmentOpUtil::getMultisampleAccess
          (PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *original)

{
  int height;
  int depth;
  int rowPitch;
  
  height = (original->super_ConstPixelBufferAccess).m_size.m_data[0];
  depth = (original->super_ConstPixelBufferAccess).m_size.m_data[1];
  rowPitch = tcu::TextureFormat::getPixelSize((TextureFormat *)original);
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,(TextureFormat *)original,1,height,depth,rowPitch,
             (original->super_ConstPixelBufferAccess).m_pitch.m_data[1],
             (original->super_ConstPixelBufferAccess).m_data);
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess getMultisampleAccess(const tcu::PixelBufferAccess& original)
{
	return tcu::PixelBufferAccess(original.getFormat(),
								  1,
								  original.getWidth(),
								  original.getHeight(),
								  original.getFormat().getPixelSize(),
								  original.getRowPitch(),
								  original.getDataPtr());
}